

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

LY_ERR lyb_parse_model(lylyb_ctx *lybctx,uint32_t parse_options,ly_bool with_features,
                      lys_module **mod)

{
  ulong uVar1;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aVar2;
  LY_ERR LVar3;
  int iVar4;
  lys_module *mod_00;
  lysp_feature *last;
  LY_ERR LVar5;
  lys_module *feat_set_00;
  char *format;
  char *pcVar6;
  undefined7 in_register_00000011;
  ly_ctx *plVar7;
  char *pcVar8;
  ulong uVar9;
  char *pcVar10;
  uint32_t idx;
  char mod_rev [11];
  char *mod_name;
  ly_set feat_set;
  uint32_t local_78;
  char local_73 [11];
  char *local_68;
  lys_module **local_60;
  int local_54;
  char *local_50;
  ly_ctx *local_48;
  anon_union_8_3_0df1e6ad_for_ly_set_2 aStack_40;
  
  iVar4 = (int)CONCAT71(in_register_00000011,with_features);
  mod_00 = (lys_module *)0x0;
  local_50 = (char *)0x0;
  local_48 = (ly_ctx *)0x0;
  aStack_40.dnodes = (lyd_node **)0x0;
  local_78 = 0;
  feat_set_00 = (lys_module *)&stack0xffffffffffffffb8;
  if (iVar4 == 0) {
    feat_set_00 = mod_00;
  }
  pcVar10 = local_73;
  LVar3 = lyb_read_model(lybctx,&local_50,pcVar10,(ly_set *)feat_set_00);
  pcVar6 = local_50;
  LVar5 = LY_EMEM;
  if (LVar3 != LY_SUCCESS) goto LAB_001395ce;
  local_54 = iVar4;
  if (local_73[0] == '\0') {
    mod_00 = ly_ctx_get_module_latest(lybctx->ctx,local_50);
LAB_0013969c:
    if (mod_00 == (lys_module *)0x0) goto LAB_00139677;
LAB_001396a1:
    local_68 = pcVar6;
    if (mod_00->implemented != '\0') {
      local_60 = mod;
      if ((char)local_54 != '\0') {
        last = lysp_feature_next((lysp_feature *)0x0,mod_00->parsed,&local_78);
        aVar2 = aStack_40;
        while (aStack_40 = aVar2, last != (lysp_feature *)0x0) {
          uVar1 = (ulong)local_48 >> 0x20;
          if (uVar1 != 0) {
            pcVar10 = last->name;
            uVar9 = 0;
            do {
              iVar4 = strcmp((char *)aVar2.dnodes[uVar9],pcVar10);
              if (iVar4 == 0) {
                if ((last->flags & 0x20) != 0) goto LAB_00139716;
                plVar7 = lybctx->ctx;
                pcVar6 = 
                "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.";
                goto LAB_00139829;
              }
              uVar9 = uVar9 + 1;
            } while (uVar1 != uVar9);
          }
          if ((last->flags & 0x20) != 0) {
            plVar7 = lybctx->ctx;
            pcVar10 = last->name;
            pcVar6 = 
            "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.";
LAB_00139829:
            ly_log(plVar7,LY_LLERR,LY_EINVAL,pcVar6,local_68,pcVar10);
            LVar5 = LY_EINVAL;
            mod = local_60;
            goto LAB_001395ce;
          }
LAB_00139716:
          last = lysp_feature_next(last,mod_00->parsed,&local_78);
          aVar2 = aStack_40;
        }
      }
      lyb_cache_module_hash(mod_00);
      LVar5 = LY_SUCCESS;
      mod = local_60;
      goto LAB_001395ce;
    }
    LVar5 = LY_SUCCESS;
    if (((parse_options >> 0x11 & 1) == 0) || (LVar5 = LY_EINVAL, mod_00->implemented != '\0'))
    goto LAB_001395ce;
    plVar7 = lybctx->ctx;
    pcVar8 = "@";
    if (local_73[0] == '\0') {
      pcVar8 = "";
      pcVar10 = "";
    }
    format = "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.";
  }
  else {
    mod_00 = ly_ctx_get_module(lybctx->ctx,local_50,local_73);
    if (mod_00 != (lys_module *)0x0 || (parse_options >> 0x14 & 1) == 0) goto LAB_0013969c;
    mod_00 = ly_ctx_get_module_implemented(lybctx->ctx,pcVar6);
    if (((mod_00 != (lys_module *)0x0) && (mod_00->revision != (char *)0x0)) &&
       (iVar4 = strcmp(mod_00->revision,local_73), -1 < iVar4)) goto LAB_001396a1;
LAB_00139677:
    if ((parse_options >> 0x11 & 1) == 0) {
      LVar5 = LY_SUCCESS;
      mod_00 = (lys_module *)0x0;
      goto LAB_001395ce;
    }
    plVar7 = lybctx->ctx;
    pcVar8 = "@";
    if (local_73[0] == '\0') {
      pcVar8 = "";
      pcVar10 = "";
    }
    format = "Invalid context for LYB data parsing, missing module \"%s%s%s\".";
    mod_00 = (lys_module *)0x0;
  }
  ly_log(plVar7,LY_LLERR,LY_EINVAL,format,pcVar6,pcVar8,pcVar10);
  LVar5 = LY_EINVAL;
LAB_001395ce:
  *mod = mod_00;
  free(local_50);
  ly_set_erase((ly_set *)&stack0xffffffffffffffb8,free);
  return LVar5;
}

Assistant:

static LY_ERR
lyb_parse_model(struct lylyb_ctx *lybctx, uint32_t parse_options, ly_bool with_features, const struct lys_module **mod)
{
    LY_ERR ret = LY_SUCCESS;
    const struct lys_module *m = NULL;
    char *mod_name = NULL, mod_rev[LY_REV_SIZE];
    struct ly_set feat_set = {0};
    struct lysp_feature *f = NULL;
    uint32_t i, idx = 0;
    ly_bool enabled;

    /* read module info */
    if ((ret = lyb_read_model(lybctx, &mod_name, mod_rev, with_features ? &feat_set : NULL))) {
        goto cleanup;
    }

    /* get the module */
    if (mod_rev[0]) {
        m = ly_ctx_get_module(lybctx->ctx, mod_name, mod_rev);
        if ((parse_options & LYD_PARSE_LYB_MOD_UPDATE) && !m) {
            /* try to use an updated module */
            m = ly_ctx_get_module_implemented(lybctx->ctx, mod_name);
            if (m && (!m->revision || (strcmp(m->revision, mod_rev) < 0))) {
                /* not an implemented module in a newer revision */
                m = NULL;
            }
        }
    } else {
        m = ly_ctx_get_module_latest(lybctx->ctx, mod_name);
    }

    if (!m || !m->implemented) {
        if (parse_options & LYD_PARSE_STRICT) {
            if (!m) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            } else if (!m->implemented) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
                        mod_name, mod_rev[0] ? "@" : "", mod_rev[0] ? mod_rev : "");
            }
            ret = LY_EINVAL;
            goto cleanup;
        }

        goto cleanup;
    }

    if (with_features) {
        /* check features */
        while ((f = lysp_feature_next(f, m->parsed, &idx))) {
            enabled = 0;
            for (i = 0; i < feat_set.count; ++i) {
                if (!strcmp(feat_set.objs[i], f->name)) {
                    enabled = 1;
                    break;
                }
            }

            if (enabled && !(f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature disabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            } else if (!enabled && (f->flags & LYS_FENABLED)) {
                LOGERR(lybctx->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s\" has \"%s\" feature enabled.",
                        mod_name, f->name);
                ret = LY_EINVAL;
                goto cleanup;
            }
        }
    }

    /* fill cached hashes, if not already */
    lyb_cache_module_hash(m);

cleanup:
    *mod = m;
    free(mod_name);
    ly_set_erase(&feat_set, free);
    return ret;
}